

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

void la_miam_core_v1_data_format_text(la_vstring *vstr,void *data,int indent)

{
  _Bool _Var1;
  ulong in_RAX;
  void *pvVar2;
  xmlBufferPtr pxVar3;
  char *pcVar4;
  _Bool prettify_xml;
  undefined8 uStack_28;
  
  if (*(ushort *)((long)data + 0x10) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 0x10),indent);
    return;
  }
  uStack_28 = in_RAX;
  la_vstring_append_sprintf
            (vstr,"%*sPDU Length: %u\n",(ulong)(uint)indent,"",(ulong)*(uint *)((long)data + 8));
  la_vstring_append_sprintf(vstr,"%*sAircraft ID: %s\n",(ulong)(uint)indent,"",(long)data + 0x18);
  la_vstring_append_sprintf
            (vstr,"%*sMsg num: %u\n",(ulong)(uint)indent,"",(ulong)*(byte *)((long)data + 0x27));
  pcVar4 = "not ";
  if (*(char *)((long)data + 0x28) == '\x01') {
    pcVar4 = "";
  }
  la_vstring_append_sprintf(vstr,"%*sACK: %srequired\n",(ulong)(uint)indent,"",pcVar4);
  pvVar2 = la_dict_search(la_miam_core_v1_data_format_text::v1_compression_names,
                          (uint)*(byte *)((long)data + 0x29));
  if (pvVar2 == (void *)0x0) {
    la_vstring_append_sprintf
              (vstr,"%*sCompression: unknown (%u)\n",(ulong)(uint)indent,"",
               (ulong)*(byte *)((long)data + 0x29));
  }
  else {
    la_vstring_append_sprintf(vstr,"%*sCompression: %s\n",(ulong)(uint)indent,"",pvVar2);
  }
  pvVar2 = la_dict_search(la_miam_core_v1_data_format_text::v1_encoding_names,
                          (uint)*(byte *)((long)data + 0x2a));
  if (pvVar2 == (void *)0x0) {
    la_vstring_append_sprintf
              (vstr,"%*sEncoding: unknown (%u)\n",(ulong)(uint)indent,"",
               (ulong)*(byte *)((long)data + 0x2a));
  }
  else {
    la_vstring_append_sprintf(vstr,"%*sEncoding: %s\n",(ulong)(uint)indent,"",pvVar2);
  }
  if (*(byte *)((long)data + 0x2b) < 3) {
    la_vstring_append_sprintf(vstr,"%*sACARS:\n",(ulong)(uint)indent,"");
    indent = indent + 1;
    la_vstring_append_sprintf
              (vstr,"%*sLabel: %c%c",(ulong)(uint)indent,"",
               (ulong)(uint)(int)*(char *)((long)data + 0x20),
               (ulong)(uint)(int)*(char *)((long)data + 0x21));
    if ((byte)(*(char *)((long)data + 0x2b) - 1U) < 2) {
      la_vstring_append_sprintf
                (vstr," Sublabel: %c%c",(ulong)(uint)(int)*(char *)((long)data + 0x22),
                 (ulong)(uint)(int)*(char *)((long)data + 0x23));
    }
    if (*(char *)((long)data + 0x2b) == '\x02') {
      la_vstring_append_sprintf
                (vstr," MFI: %c%c",(ulong)(uint)(int)*(char *)((long)data + 0x24),
                 (ulong)(uint)(int)*(char *)((long)data + 0x25));
    }
    la_vstring_append_sprintf(vstr,"%s","\n");
  }
  else if (*(byte *)((long)data + 0x2b) == 3) {
    la_vstring_append_sprintf(vstr,"%*sNon-ACARS payload:\n",(ulong)(uint)indent,"");
    indent = indent + 1;
    la_vstring_append_sprintf
              (vstr,"%*sApplication ID: %s\n",(ulong)(uint)indent,"",(long)data + 0x20);
  }
  if (*data != (uint8_t *)0x0) {
    _Var1 = is_printable(*data,*(uint32_t *)((long)data + 0xc));
    if (_Var1) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      la_config_get_bool("prettify_xml",(_Bool *)((long)&uStack_28 + 7));
      if (uStack_28._7_1_ == '\x01') {
        pxVar3 = la_prettify_xml(*data);
        if (pxVar3 == (xmlBufferPtr)0x0) {
          uStack_28 = uStack_28 & 0xffffffffffffff;
        }
        else {
          la_vstring_append_sprintf(vstr,"%*sMessage (reformatted):\n",(ulong)(uint)indent,"");
          la_isprintf_multiline_text(vstr,indent + 1,(char *)pxVar3->content);
          xmlBufferFree(pxVar3);
        }
      }
      if (uStack_28._7_1_ == '\0') {
        la_vstring_append_sprintf(vstr,"%*sMessage:\n",(ulong)(uint)indent,"");
        la_isprintf_multiline_text(vstr,indent + 1,*data);
      }
    }
    else {
      pcVar4 = la_hexdump(*data,(ulong)*(uint *)((long)data + 0xc));
      la_vstring_append_sprintf(vstr,"%*sMessage:\n",(ulong)(uint)indent,"");
      la_isprintf_multiline_text(vstr,indent + 1,pcVar4);
      free(pcVar4);
    }
  }
  if (*(ushort *)((long)data + 0x12) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 0x12) << 0x10,indent + 1);
  }
  return;
}

Assistant:

static void la_miam_core_v1_data_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	static la_dict const v1_compression_names[] = {
		{ .id = LA_MIAM_CORE_V1_COMP_NONE,      .val = "none" },
		{ .id = LA_MIAM_CORE_V1_COMP_DEFLATE,   .val = "deflate" },
		{ .id = 0x0,                            .val = NULL }
	};

	static la_dict const v1_encoding_names[] = {
		{ .id = LA_MIAM_CORE_V1_ENC_ISO5,       .val = "ISO #5" },
		{ .id = LA_MIAM_CORE_V1_ENC_BINARY,     .val = "binary" },
		{ .id = 0x0,                            .val = NULL }
	};

	la_miam_core_v1_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "PDU Length: %u\n", pdu->pdu_len);
	LA_ISPRINTF(vstr, indent, "Aircraft ID: %s\n", pdu->aircraft_id);
	LA_ISPRINTF(vstr, indent, "Msg num: %u\n", pdu->msg_num);
	LA_ISPRINTF(vstr, indent, "ACK: %srequired\n",
			(pdu->ack_option == 1 ? "" : "not "));

	char *name = la_dict_search(v1_compression_names, pdu->compression);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Compression: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Compression: unknown (%u)\n", pdu->compression);
	}

	name = la_dict_search(v1_encoding_names, pdu->encoding);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Encoding: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Encoding: unknown (%u)\n", pdu->encoding);
	}

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V1_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_6CHAR:
			LA_ISPRINTF(vstr, indent, "ACARS:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Label: %c%c",
					pdu->app_id[0], pdu->app_id[1]);

			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " Sublabel: %c%c",
						pdu->app_id[2], pdu->app_id[3]);
			}

			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " MFI: %c%c",
						pdu->app_id[4], pdu->app_id[5]);
			}

			la_vstring_append_sprintf(vstr, "%s", "\n");

			break;
		case LA_MIAM_CORE_V1_APP_NONACARS_6CHAR:
			LA_ISPRINTF(vstr, indent, "Non-ACARS payload:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Application ID: %s\n", pdu->app_id);
			break;
		default:
			break;
	}

	if(pdu->data != NULL) {
		// Don't trust pdu->encoding - if the payload is printable, then print it as text.
		// Otherwise print a hexdump.
		if(is_printable(pdu->data, pdu->data_len)) {
			// Parser has appended '\0' at the end, so it's safe to print it directly
			bool prettify_xml = false;
#ifdef WITH_LIBXML2
			(void)la_config_get_bool("prettify_xml", &prettify_xml);
			if(prettify_xml == true) {
				xmlBufferPtr xmlbufptr = NULL;
				if((xmlbufptr = la_prettify_xml((char *)pdu->data)) != NULL) {
					LA_ISPRINTF(vstr, indent, "Message (reformatted):\n");
					la_isprintf_multiline_text(vstr, indent + 1, (char *)xmlbufptr->content);
					xmlBufferFree(xmlbufptr);
				} else {
					// Doesn't look like XML - print it as normal
					prettify_xml = false;
				}
			}
#endif
			if(prettify_xml == false) {
				LA_ISPRINTF(vstr, indent, "Message:\n");
				la_isprintf_multiline_text(vstr, indent + 1, (char *)pdu->data);
			}
		} else {
			char *hexdump = la_hexdump((uint8_t *)pdu->data, pdu->data_len);
			LA_ISPRINTF(vstr, indent, "Message:\n");
			la_isprintf_multiline_text(vstr, indent + 1, hexdump);
			LA_XFREE(hexdump);
		}
	}

	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_BODY, indent + 1);
		return;
	}
}